

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_order.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalOrderMergeTask::PhysicalOrderMergeTask
          (PhysicalOrderMergeTask *this,shared_ptr<duckdb::Event,_true> *event_p,
          ClientContext *context,OrderGlobalSinkState *state,PhysicalOperator *op_p)

{
  shared_ptr<duckdb::Event,_true> local_38;
  
  local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ExecutorTask::ExecutorTask(&this->super_ExecutorTask,context,&local_38,op_p);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (this->super_ExecutorTask).super_Task._vptr_Task = (_func_int **)&PTR__ExecutorTask_017a94a0;
  this->context = context;
  this->state = state;
  return;
}

Assistant:

PhysicalOrderMergeTask(shared_ptr<Event> event_p, ClientContext &context, OrderGlobalSinkState &state,
	                       const PhysicalOperator &op_p)
	    : ExecutorTask(context, std::move(event_p), op_p), context(context), state(state) {
	}